

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

stbi_uc * stbi_hdr_load_rgbe(char *filename,int *x,int *y,int *comp,int req_comp)

{
  FILE *__stream;
  stbi_uc *psVar1;
  stbi sStack_48;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    failure_reason = "Unable to open file";
    psVar1 = (stbi_uc *)0x0;
  }
  else {
    sStack_48.img_file = (FILE *)__stream;
    psVar1 = hdr_load_rgbe(&sStack_48,x,y,comp,req_comp);
    fclose(__stream);
  }
  return psVar1;
}

Assistant:

stbi_uc *stbi_hdr_load_rgbe        (char const *filename,           int *x, int *y, int *comp, int req_comp)
{
   FILE *f = fopen(filename, "rb");
   unsigned char *result;
   if (!f) return epuc("can't fopen", "Unable to open file");
   result = stbi_hdr_load_rgbe_file(f,x,y,comp,req_comp);
   fclose(f);
   return result;
}